

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O1

BlockSet * __thiscall
spvtools::opt::InvocationInterlockPlacementPass::computeReachableBlocks
          (BlockSet *__return_storage_ptr__,InvocationInterlockPlacementPass *this,
          BlockSet *previous_inside,BlockSet *starting_nodes,bool reverse_cfg)

{
  uint32_t block_id;
  size_t sVar1;
  undefined4 uVar2;
  deque<unsigned_int,_std::allocator<unsigned_int>_> worklist;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  iterator local_70;
  const_iterator local_50;
  
  (__return_storage_ptr__->_M_h)._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->_M_h)._M_bucket_count = (starting_nodes->_M_h)._M_bucket_count;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = (starting_nodes->_M_h)._M_element_count;
  uVar2 = *(undefined4 *)&(starting_nodes->_M_h)._M_rehash_policy.field_0x4;
  sVar1 = (starting_nodes->_M_h)._M_rehash_policy._M_next_resize;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor =
       (starting_nodes->_M_h)._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy.field_0x4 = uVar2;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = sVar1;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)__return_storage_ptr__;
  std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)__return_storage_ptr__,&starting_nodes->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> *)
             &local_c8);
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (uint32_t *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (uint32_t *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (uint32_t *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (uint32_t *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_c8,0);
  local_50._M_cur = local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_50._M_first = local_c8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_50._M_last = local_c8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_50._M_node = local_c8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::deque<unsigned_int,std::allocator<unsigned_int>>::
  insert<std::__detail::_Node_const_iterator<unsigned_int,true,false>,void>
            (&local_70,(deque<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,&local_50,
             (_Node_const_iterator<unsigned_int,_true,_false>)
             (starting_nodes->_M_h)._M_before_begin._M_nxt,
             (_Node_const_iterator<unsigned_int,_true,_false>)0x0);
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      block_id = *local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_c8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_c8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_c8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_c8._M_impl.super__Deque_impl_data._M_start._M_last =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      local_e8._M_unused._M_object = (void *)0x0;
      local_e8._8_8_ = 0;
      local_d8 = (code *)0x0;
      pcStack_d0 = (code *)0x0;
      local_e8._M_unused._M_object = operator_new(0x18);
      *(BlockSet **)local_e8._M_unused._0_8_ = __return_storage_ptr__;
      *(BlockSet **)((long)local_e8._M_unused._0_8_ + 8) = previous_inside;
      *(_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> **)
       ((long)local_e8._M_unused._0_8_ + 0x10) = &local_c8;
      pcStack_d0 = std::
                   _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:252:17)>
                   ::_M_invoke;
      local_d8 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:252:17)>
                 ::_M_manager;
      forEachNext(this,block_id,reverse_cfg,(function<void_(unsigned_int)> *)&local_e8);
      if (local_d8 != (code *)0x0) {
        (*local_d8)(&local_e8,&local_e8,__destroy_functor);
      }
    } while (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

InvocationInterlockPlacementPass::BlockSet
InvocationInterlockPlacementPass::computeReachableBlocks(
    BlockSet& previous_inside, const BlockSet& starting_nodes,
    bool reverse_cfg) {
  BlockSet inside = starting_nodes;

  std::deque<uint32_t> worklist;
  worklist.insert(worklist.begin(), starting_nodes.begin(),
                  starting_nodes.end());

  while (!worklist.empty()) {
    uint32_t block_id = worklist.front();
    worklist.pop_front();

    forEachNext(block_id, reverse_cfg,
                [&inside, &previous_inside, &worklist](uint32_t next_id) {
                  previous_inside.insert(next_id);
                  if (inside.insert(next_id).second) {
                    worklist.push_back(next_id);
                  }
                });
  }

  return inside;
}